

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_extension.c
# Opt level: O2

apx_error_t apx_socketServerExtension_init(apx_server_tag *apx_server,dtl_dv_t *config)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *tag;
  apx_error_t aVar7;
  apx_error_t aVar8;
  char local_39;
  long local_38;
  
  aVar7 = 0;
  aVar8 = 0;
  if (m_instance == (apx_socketServer_t *)0x0) {
    m_instance = apx_socketServer_new(apx_server);
    if (m_instance == (apx_socketServer_t *)0x0) {
      aVar8 = 2;
    }
    else if (config != (dtl_dv_t *)0x0) {
      iVar1 = dtl_dv_type(config);
      if (iVar1 == 4) {
        lVar3 = dtl_hv_get_cstr(config,"tcp-port");
        lVar4 = dtl_hv_get_cstr(config,"unix-file");
        lVar5 = dtl_hv_get_cstr(config,"tcp-tag");
        local_38 = dtl_hv_get_cstr(config,"unix-tag");
        if (((lVar3 != 0) && (uVar2 = dtl_sv_to_u32(lVar3,&local_39), local_39 == '\x01')) &&
           ((uVar2 & 0xfc00) - 0x400 < 0xbc00)) {
          if (lVar5 == 0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = (char *)dtl_sv_to_cstr(lVar5,&local_39);
          }
          apx_socketServer_start_tcp_server(m_instance,(uint16_t)uVar2,pcVar6);
        }
        aVar8 = aVar7;
        if (((lVar4 != 0) && (pcVar6 = (char *)dtl_sv_to_cstr(lVar4,&local_39), local_39 == '\x01'))
           && (*pcVar6 != '\0')) {
          if (local_38 == 0) {
            tag = "";
          }
          else {
            tag = (char *)dtl_sv_to_cstr(local_38,&local_39);
          }
          apx_socketServer_start_unix_server(m_instance,pcVar6,tag);
        }
      }
      else {
        aVar8 = 0x43;
      }
    }
  }
  return aVar8;
}

Assistant:

static apx_error_t apx_socketServerExtension_init(struct apx_server_tag *apx_server, dtl_dv_t *config)
{
   if (m_instance == 0)
   {
      m_instance = apx_socketServer_new(apx_server);
      if (m_instance == 0)
      {
         return APX_MEM_ERROR;
      }
      if (config != 0)
      {
         if (dtl_dv_type(config) == DTL_DV_HASH)
         {
            return apx_socketServerExtension_configure(m_instance, (dtl_hv_t*) config);
         }
         else
         {
            return APX_VALUE_TYPE_ERROR;
         }
      }
   }
   return APX_NO_ERROR;
}